

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_block_sizes.cpp
# Opt level: O3

void assign_kmeans_texels(block_size_descriptor *bsd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  byte bVar14;
  int iVar13;
  uint8_t uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  uint64_t rng_state [2];
  bool seen [216];
  astc aaStack_108 [16];
  char local_f8 [224];
  undefined1 auVar20 [32];
  
  bVar14 = bsd->texel_count;
  uVar17 = (ulong)bVar14;
  if (uVar17 < 0x41) {
    if (uVar17 != 0) {
      lVar16 = uVar17 - 1;
      auVar19._8_8_ = lVar16;
      auVar19._0_8_ = lVar16;
      auVar20._16_8_ = lVar16;
      auVar20._0_16_ = auVar19;
      auVar20._24_8_ = lVar16;
      auVar3 = vpmovsxbq_avx2(ZEXT416(0x1f1e1d1c));
      auVar4 = vpmovsxbq_avx2(ZEXT416(0x1b1a1918));
      auVar5 = vpmovsxbq_avx2(ZEXT416(0x17161514));
      auVar6 = vpmovsxbq_avx2(ZEXT416(0x13121110));
      auVar7 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
      auVar8 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
      auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar10 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      uVar17 = 0;
      auVar21._8_8_ = 0x8000000000000000;
      auVar21._0_8_ = 0x8000000000000000;
      auVar22._8_8_ = 0x8000000000000000;
      auVar22._0_8_ = 0x8000000000000000;
      auVar22._16_8_ = 0x8000000000000000;
      auVar22._24_8_ = 0x8000000000000000;
      auVar1 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      auVar31._8_8_ = 0x20;
      auVar31._0_8_ = 0x20;
      auVar31._16_8_ = 0x20;
      auVar31._24_8_ = 0x20;
      do {
        auVar23 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar21,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        uVar15 = (uint8_t)uVar17;
        if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17] = uVar15;
        }
        auVar23 = vpcmpgtq_avx(auVar10._0_16_ ^ auVar21,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 1] = uVar15 + '\x01';
        }
        auVar12 = auVar22 ^ auVar20;
        auVar2 = vpcmpgtq_avx2(auVar10 ^ auVar22,auVar12);
        auVar11 = vpshuflw_avx2(auVar2,0xe8);
        auVar23._0_4_ = auVar11._16_4_;
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = auVar23._0_4_;
        auVar23._12_4_ = auVar23._0_4_;
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 2] = uVar15 + '\x02';
        }
        auVar23 = vpackssdw_avx(auVar2._16_16_,auVar2._16_16_);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 3] = uVar15 + '\x03';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar9._0_16_,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23 ^ auVar1),0x55);
        auVar2 = vpackssdw_avx2(auVar2,auVar20);
        auVar24._0_2_ = auVar2._16_2_;
        auVar24._2_2_ = auVar24._0_2_;
        auVar24._4_2_ = auVar24._0_2_;
        auVar24._6_2_ = auVar24._0_2_;
        auVar24._8_2_ = auVar24._0_2_;
        auVar24._10_2_ = auVar24._0_2_;
        auVar24._12_2_ = auVar24._0_2_;
        auVar24._14_2_ = auVar24._0_2_;
        auVar23 = vpacksswb_avx(auVar24,auVar24);
        if ((auVar23 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 4] = uVar15 + '\x04';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar9._0_16_,auVar21 ^ auVar19);
        auVar23 = vpshufhw_avx(auVar23,0x84);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23 ^ auVar1),0x55);
        auVar2 = vpackssdw_avx2(auVar2,auVar20);
        auVar25._0_4_ = auVar2._16_4_;
        auVar25._4_4_ = auVar25._0_4_;
        auVar25._8_4_ = auVar25._0_4_;
        auVar25._12_4_ = auVar25._0_4_;
        auVar23 = vpacksswb_avx(auVar25,auVar25);
        if ((auVar23 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 5] = uVar15 + '\x05';
        }
        auVar11 = vpcmpgtq_avx2(auVar22 ^ auVar9,auVar12);
        auVar2 = vpackssdw_avx2(auVar20,auVar11);
        auVar23 = auVar2._16_16_ ^ auVar1;
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 6] = uVar15 + '\x06';
        }
        auVar2 = vpshufhw_avx2(auVar11,0x84);
        auVar23 = auVar2._16_16_ ^ auVar1;
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 7] = uVar15 + '\a';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar8._0_16_,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar2 = vpmovzxwd_avx2(auVar23);
        auVar2 = vpacksswb_avx2(auVar2,auVar20);
        if ((auVar2 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
          bsd->kmeans_texels[uVar17 + 8] = uVar15 + '\b';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar8._0_16_,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23),0x55);
        auVar2 = vpacksswb_avx2(auVar2,auVar20);
        if ((auVar2._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 9] = uVar15 + '\t';
        }
        auVar11 = vpcmpgtq_avx2(auVar22 ^ auVar8,auVar12);
        auVar2 = vpshuflw_avx2(auVar11,0xe8);
        auVar26._0_4_ = auVar2._16_4_;
        auVar26._4_4_ = auVar26._0_4_;
        auVar26._8_4_ = auVar26._0_4_;
        auVar26._12_4_ = auVar26._0_4_;
        auVar23 = vpackssdw_avx(auVar26 ^ auVar1,auVar26 ^ auVar1);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23),0x55);
        auVar2 = vpacksswb_avx2(auVar2,auVar20);
        if ((auVar2._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 10] = uVar15 + '\n';
        }
        auVar23 = vpackssdw_avx(auVar11._16_16_,auVar11._16_16_);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23),0x55);
        auVar2 = vpacksswb_avx2(auVar2,auVar20);
        if ((auVar2._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0xb] = uVar15 + '\v';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar7._0_16_,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23 ^ auVar1),0x55);
        auVar2 = vpackssdw_avx2(auVar20,auVar2);
        auVar2 = vpacksswb_avx2(auVar2,auVar20);
        if ((auVar2._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0xc] = uVar15 + '\f';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar7._0_16_,auVar21 ^ auVar19);
        auVar23 = vpshufhw_avx(auVar23,0x84);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23 ^ auVar1),0x55);
        auVar2 = vpackssdw_avx2(auVar20,auVar2);
        auVar2 = vpacksswb_avx2(auVar2,auVar20);
        if ((auVar2._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0xd] = uVar15 + '\r';
        }
        auVar11 = vpcmpgtq_avx2(auVar22 ^ auVar7,auVar12);
        auVar2 = vpackssdw_avx2(auVar20,auVar11);
        auVar2 = vpackssdw_avx2(auVar20,auVar2 ^ _DAT_0032b200);
        auVar2 = vpacksswb_avx2(auVar2,auVar20);
        if ((auVar2._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0xe] = uVar15 + '\x0e';
        }
        auVar2 = vpshufhw_avx2(auVar11,0x84);
        auVar2 = vpackssdw_avx2(auVar20,auVar2 ^ _DAT_0032b200);
        auVar2 = vpacksswb_avx2(auVar2,auVar20);
        if ((auVar2._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0xf] = uVar15 + '\x0f';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar6._0_16_,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x10] = uVar15 + '\x10';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar6._0_16_,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x11] = uVar15 + '\x11';
        }
        auVar2 = vpcmpgtq_avx2(auVar22 ^ auVar6,auVar12);
        auVar11 = vpshuflw_avx2(auVar2,0xe8);
        auVar27._0_4_ = auVar11._16_4_;
        auVar27._4_4_ = auVar27._0_4_;
        auVar27._8_4_ = auVar27._0_4_;
        auVar27._12_4_ = auVar27._0_4_;
        auVar23 = vpackssdw_avx(auVar27 ^ auVar1,auVar27 ^ auVar1);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x12] = uVar15 + '\x12';
        }
        auVar23 = vpackssdw_avx(auVar2._16_16_,auVar2._16_16_);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x13] = uVar15 + '\x13';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar5._0_16_,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23 ^ auVar1),0x55);
        auVar2 = vpackssdw_avx2(auVar2,auVar20);
        auVar28._0_2_ = auVar2._16_2_;
        auVar28._2_2_ = auVar28._0_2_;
        auVar28._4_2_ = auVar28._0_2_;
        auVar28._6_2_ = auVar28._0_2_;
        auVar28._8_2_ = auVar28._0_2_;
        auVar28._10_2_ = auVar28._0_2_;
        auVar28._12_2_ = auVar28._0_2_;
        auVar28._14_2_ = auVar28._0_2_;
        auVar23 = vpacksswb_avx(auVar28,auVar28);
        if ((auVar23 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x14] = uVar15 + '\x14';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar5._0_16_,auVar21 ^ auVar19);
        auVar23 = vpshufhw_avx(auVar23,0x84);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23 ^ auVar1),0x55);
        auVar2 = vpackssdw_avx2(auVar2,auVar20);
        auVar29._0_4_ = auVar2._16_4_;
        auVar29._4_4_ = auVar29._0_4_;
        auVar29._8_4_ = auVar29._0_4_;
        auVar29._12_4_ = auVar29._0_4_;
        auVar23 = vpacksswb_avx(auVar29,auVar29);
        if ((auVar23 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x15] = uVar15 + '\x15';
        }
        auVar11 = vpcmpgtq_avx2(auVar22 ^ auVar5,auVar12);
        auVar2 = vpackssdw_avx2(auVar20,auVar11);
        auVar23 = auVar2._16_16_ ^ auVar1;
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x16] = uVar15 + '\x16';
        }
        auVar2 = vpshufhw_avx2(auVar11,0x84);
        auVar23 = auVar2._16_16_ ^ auVar1;
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpacksswb_avx(auVar23,auVar23);
        if ((auVar23 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x17] = uVar15 + '\x17';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar4._0_16_,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar2 = vpmovzxwd_avx2(auVar23);
        auVar2 = vpacksswb_avx2(auVar20,auVar2);
        if ((auVar2 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
          bsd->kmeans_texels[uVar17 + 0x18] = uVar15 + '\x18';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar4._0_16_,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23),0x55);
        auVar2 = vpacksswb_avx2(auVar20,auVar2);
        if ((auVar2._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x19] = uVar15 + '\x19';
        }
        auVar11 = vpcmpgtq_avx2(auVar22 ^ auVar4,auVar12);
        auVar2 = vpshuflw_avx2(auVar11,0xe8);
        auVar30._0_4_ = auVar2._16_4_;
        auVar30._4_4_ = auVar30._0_4_;
        auVar30._8_4_ = auVar30._0_4_;
        auVar30._12_4_ = auVar30._0_4_;
        auVar23 = vpackssdw_avx(auVar30 ^ auVar1,auVar30 ^ auVar1);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23),0x55);
        auVar2 = vpacksswb_avx2(auVar20,auVar2);
        if ((auVar2._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x1a] = uVar15 + '\x1a';
        }
        auVar23 = vpackssdw_avx(auVar11._16_16_,auVar11._16_16_);
        auVar23 = vpackssdw_avx(auVar23 ^ auVar1,auVar23 ^ auVar1);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23),0x55);
        auVar2 = vpacksswb_avx2(auVar20,auVar2);
        if ((auVar2._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x1b] = uVar15 + '\x1b';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar3._0_16_,auVar21 ^ auVar19);
        auVar23 = vpackssdw_avx(auVar23,auVar23);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23 ^ auVar1),0x55);
        auVar2 = vpackssdw_avx2(auVar20,auVar2);
        auVar2 = vpacksswb_avx2(auVar20,auVar2);
        if ((auVar2._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x1c] = uVar15 + '\x1c';
        }
        auVar23 = vpcmpgtq_avx(auVar21 ^ auVar3._0_16_,auVar21 ^ auVar19);
        auVar23 = vpshufhw_avx(auVar23,0x84);
        auVar2 = vpermq_avx2(ZEXT1632(auVar23 ^ auVar1),0x55);
        auVar2 = vpackssdw_avx2(auVar20,auVar2);
        auVar2 = vpacksswb_avx2(auVar20,auVar2);
        if ((auVar2._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x1d] = uVar15 + '\x1d';
        }
        auVar11 = vpcmpgtq_avx2(auVar22 ^ auVar3,auVar12);
        auVar2 = vpackssdw_avx2(auVar20,auVar11);
        auVar2 = vpackssdw_avx2(auVar20,auVar2 ^ _DAT_0032b200);
        auVar2 = vpacksswb_avx2(auVar20,auVar2);
        if ((auVar2._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x1e] = uVar15 + '\x1e';
        }
        auVar2 = vpshufhw_avx2(auVar11,0x84);
        auVar2 = vpackssdw_avx2(auVar20,auVar2 ^ _DAT_0032b200);
        auVar2 = vpacksswb_avx2(auVar20,auVar2);
        if ((auVar2._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bsd->kmeans_texels[uVar17 + 0x1f] = uVar15 + '\x1f';
        }
        uVar17 = uVar17 + 0x20;
        auVar10 = vpaddq_avx2(auVar10,auVar31);
        auVar9 = vpaddq_avx2(auVar31,auVar9);
        auVar8 = vpaddq_avx2(auVar31,auVar8);
        auVar7 = vpaddq_avx2(auVar31,auVar7);
        auVar6 = vpaddq_avx2(auVar31,auVar6);
        auVar5 = vpaddq_avx2(auVar31,auVar5);
        auVar4 = vpaddq_avx2(auVar31,auVar4);
        auVar3 = vpaddq_avx2(auVar31,auVar3);
      } while ((bVar14 + 0x1f & 0xe0) != uVar17);
    }
  }
  else {
    astc::rand_init((uint64_t *)aaStack_108);
    if ((ulong)bsd->texel_count != 0) {
      memset(local_f8,0,(ulong)bsd->texel_count);
    }
    uVar17 = 0;
    do {
      iVar13 = astc::rand(aaStack_108);
      bVar14 = (byte)(((ushort)iVar13 & 0xff) % (ushort)bsd->texel_count);
      uVar18 = uVar17;
      if (local_f8[bVar14] == '\0') {
        uVar18 = (ulong)((int)uVar17 + 1);
        bsd->kmeans_texels[uVar17] = bVar14;
        local_f8[bVar14] = '\x01';
      }
      uVar17 = uVar18;
    } while ((uint)uVar18 < 0x40);
  }
  return;
}

Assistant:

static void assign_kmeans_texels(
	block_size_descriptor& bsd
) {
	// Use all texels for kmeans on a small block
	if (bsd.texel_count <= BLOCK_MAX_KMEANS_TEXELS)
	{
		for (uint8_t i = 0; i < bsd.texel_count; i++)
		{
			bsd.kmeans_texels[i] = i;
		}

		return;
	}

	// Select a random subset of BLOCK_MAX_KMEANS_TEXELS for kmeans on a large block
	uint64_t rng_state[2];
	astc::rand_init(rng_state);

	// Initialize array used for tracking used indices
	bool seen[BLOCK_MAX_TEXELS];
	for (uint8_t i = 0; i < bsd.texel_count; i++)
	{
		seen[i] = false;
	}

	// Assign 64 random indices, retrying if we see repeats
	unsigned int arr_elements_set = 0;
	while (arr_elements_set < BLOCK_MAX_KMEANS_TEXELS)
	{
		uint8_t texel = static_cast<uint8_t>(astc::rand(rng_state));
		texel = texel % bsd.texel_count;
		if (!seen[texel])
		{
			bsd.kmeans_texels[arr_elements_set++] = texel;
			seen[texel] = true;
		}
	}
}